

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall ASTFactory::create(ASTFactory *this)

{
  AST *p;
  RefCount<AST> *in_RSI;
  Ref *in_RDI;
  ASTNode *node;
  ASTNode *in_stack_ffffffffffffffd8;
  AST *in_stack_ffffffffffffffe0;
  
  p = (AST *)(*(code *)in_RSI[1].ref)();
  (*(code *)(p->down).ref[4].ptr)(p,0);
  operator_new(0x20);
  AST::AST(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  RefCount<AST>::RefCount(in_RSI,p);
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::create()
{
	ASTNode* node = nodeFactory(); //new CommonASTNode();
	node->setType(Token::INVALID_TYPE);
	return RefAST(new AST(node));
}